

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

bool QMetaObject::invokeMethod
               (QObject *obj,char *member,ConnectionType type,void *param_4,char *param_5,
               undefined8 param_6,undefined8 param_7,void *param_8,void *param_9,void *param_10,
               void *param_11,void *param_12,void *param_13,void *param_14,void *param_15,
               void *param_16,void *param_17,void *param_18,undefined8 param_19,char *param_20,
               char *param_21,char *param_22,char *param_23,char *param_24,char *param_25,
               char *param_26)

{
  bool bVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  void *parameters [11];
  char *typeNames [11];
  void *local_f8;
  undefined8 uStack_f0;
  void *local_e8;
  void *pvStack_e0;
  void *local_d8;
  void *pvStack_d0;
  void *local_c8;
  undefined8 uStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  char *local_98;
  void *apvStack_90 [6];
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (obj == (QObject *)0x0) {
    bVar1 = false;
  }
  else {
    apvStack_90[0] = parameters[0];
    apvStack_90[1] = parameters[2];
    apvStack_90[2] = parameters[4];
    apvStack_90[3] = parameters[6];
    apvStack_90[4] = parameters[8];
    apvStack_90[5] = parameters[10];
    pcStack_60 = typeNames[0];
    local_58 = typeNames[2];
    pcStack_50 = typeNames[4];
    local_48 = typeNames[6];
    uStack_f0 = param_7;
    local_e8 = parameters[1];
    pvStack_e0 = parameters[3];
    local_d8 = parameters[5];
    pvStack_d0 = parameters[7];
    local_c8 = parameters[9];
    uStack_c0 = param_19;
    local_b8 = typeNames[1];
    pcStack_b0 = typeNames[3];
    local_a8 = typeNames[5];
    uVar2 = 1;
    do {
      if (((char *)apvStack_90[uVar2 - 1] == (char *)0x0) || (*apvStack_90[uVar2 - 1] == '\0'))
      goto LAB_00284df4;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0xb);
    uVar2 = 0xb;
LAB_00284df4:
    local_f8 = param_4;
    local_98 = param_5;
    bVar1 = invokeMethodImpl(obj,member,type,uVar2 & 0xffffffff,&local_f8,&local_98,
                             (QMetaTypeInterface **)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaObject::invokeMethod(QObject *obj,
                               const char *member,
                               Qt::ConnectionType type,
                               QGenericReturnArgument ret,
                               QGenericArgument val0,
                               QGenericArgument val1,
                               QGenericArgument val2,
                               QGenericArgument val3,
                               QGenericArgument val4,
                               QGenericArgument val5,
                               QGenericArgument val6,
                               QGenericArgument val7,
                               QGenericArgument val8,
                               QGenericArgument val9)
{
    if (!obj)
        return false;

    const char *typeNames[] = {ret.name(), val0.name(), val1.name(), val2.name(), val3.name(),
                               val4.name(), val5.name(), val6.name(), val7.name(), val8.name(),
                               val9.name()};
    const void *parameters[] = {ret.data(), val0.data(), val1.data(), val2.data(), val3.data(),
                                val4.data(), val5.data(), val6.data(), val7.data(), val8.data(),
                                val9.data()};
    int paramCount;
    for (paramCount = 1; paramCount < MaximumParamCount; ++paramCount) {
        if (qstrlen(typeNames[paramCount]) <= 0)
            break;
    }
    return invokeMethodImpl(obj, member, type, paramCount, parameters, typeNames, nullptr);
}